

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,wasm::Visitor<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,void>>::Task,10ul>
::operator()(void *this,_func_void_Finder_ptr_Expression_ptr_ptr_conflict **Args,
            Expression ***Args_1)

{
  Expression **ppEVar1;
  undefined8 *puVar2;
  undefined8 *this_00;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *__n;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *this;
  if (uVar5 < 10) {
    *(ulong *)this = uVar5 + 1;
    ppEVar1 = *Args_1;
    *(_func_void_Finder_ptr_Expression_ptr_ptr_conflict **)((long)this + uVar5 * 0x10 + 8) = *Args;
    *(Expression ***)((long)this + uVar5 * 0x10 + 0x10) = ppEVar1;
  }
  else {
    puVar2 = *(undefined8 **)((long)this + 0xb0);
    if (puVar2 == *(undefined8 **)((long)this + 0xb8)) {
      this_00 = *(undefined8 **)((long)this + 0xa8);
      if ((long)puVar2 - (long)this_00 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)puVar2 - (long)this_00 >> 4;
      uVar5 = 1;
      if (puVar2 != this_00) {
        uVar5 = uVar8;
      }
      uVar7 = uVar5 + uVar8;
      if (0x7fffffffffffffe < uVar7) {
        uVar7 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar5,uVar8)) {
        uVar7 = 0x7ffffffffffffff;
      }
      if (uVar7 == 0) {
        puVar6 = (undefined8 *)0x0;
      }
      else {
        puVar6 = (undefined8 *)operator_new(uVar7 << 4);
      }
      ppEVar1 = *Args_1;
      puVar6[uVar8 * 2] = *Args;
      puVar6[uVar8 * 2 + 1] = ppEVar1;
      puVar3 = puVar6;
      for (__n = this_00; __n != puVar2; __n = __n + 2) {
        uVar4 = __n[1];
        *puVar3 = *__n;
        puVar3[1] = uVar4;
        puVar3 = puVar3 + 2;
      }
      std::
      _Vector_base<wasm::Walker<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,wasm::Visitor<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,void>>::Task,std::allocator<wasm::Walker<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,wasm::Visitor<wasm::ReturnUtils::findReturnCallers(wasm::Module&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,bool&)const::Finder,void>>::Task>>
      ::operator()(this_00,(pointer)(*(long *)((long)this + 0xb8) - (long)this_00 >> 4),(size_t)__n)
      ;
      *(undefined8 **)((long)this + 0xa8) = puVar6;
      *(undefined8 **)((long)this + 0xb0) = puVar3 + 2;
      *(undefined8 **)((long)this + 0xb8) = puVar6 + uVar7 * 2;
    }
    else {
      ppEVar1 = *Args_1;
      *puVar2 = *Args;
      puVar2[1] = ppEVar1;
      *(undefined8 **)((long)this + 0xb0) = puVar2 + 2;
    }
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }